

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  ulong __n;
  int iVar1;
  FieldGenerator *pFVar2;
  long *plVar3;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *psVar4;
  FieldGenerator *pFVar5;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
  *this_00;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  this->descriptor_ = descriptor;
  this_00 = &this->field_generators_;
  iVar1 = *(int *)(descriptor + 0x2c);
  lVar7 = (long)iVar1;
  __n = lVar7 * 8;
  uVar6 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar6 = 0xffffffffffffffff;
  }
  if (lVar7 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  plVar3 = (long *)operator_new__(uVar6);
  psVar4 = (scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *)(plVar3 + 1);
  *plVar3 = lVar7;
  if (lVar7 == 0) {
    this_00->array_ = psVar4;
  }
  else {
    memset(psVar4,0,__n);
    this_00->array_ = psVar4;
    if (0 < iVar1) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        psVar4 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
                 ::operator[](this_00,lVar7);
        pFVar5 = MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar8),options);
        pFVar2 = psVar4->ptr_;
        if (pFVar2 != pFVar5) {
          if (pFVar2 != (FieldGenerator *)0x0) {
            (*pFVar2->_vptr_FieldGenerator[1])();
          }
          psVar4->ptr_ = pFVar5;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x78;
      } while (lVar7 < *(int *)(descriptor + 0x2c));
    }
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
  : descriptor_(descriptor),
    field_generators_(new scoped_ptr<FieldGenerator>[descriptor->field_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(MakeGenerator(descriptor->field(i), options));
  }
}